

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O1

void __thiscall Rml::DecoratorRadialGradient::DecoratorRadialGradient(DecoratorRadialGradient *this)

{
  Decorator::Decorator(&this->super_Decorator);
  (this->super_Decorator)._vptr_Decorator = (_func_int **)&PTR__DecoratorRadialGradient_00334bc8;
  this->repeating = false;
  (this->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->shape = Circle;
  this->size_type = ClosestSide;
  (this->size).x.number = 0.0;
  (this->size).x.unit = UNKNOWN;
  (this->size).y.number = 0.0;
  (this->size).y.unit = UNKNOWN;
  (this->position).x.number = 0.0;
  (this->position).x.unit = UNKNOWN;
  (this->position).y.number = 0.0;
  (this->position).y.unit = UNKNOWN;
  return;
}

Assistant:

DecoratorRadialGradient::DecoratorRadialGradient() {}